

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

void __thiscall
choc::value::Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
          (AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *this)

{
  char cVar1;
  RepeatedGroup *pRVar2;
  long lVar3;
  ulong uVar4;
  Object *this_00;
  long *plVar5;
  
  if (this->size != 0) {
    lVar3 = 0x20;
    uVar4 = 0;
    do {
      pRVar2 = this->items;
      cVar1 = *(char *)((long)pRVar2 + lVar3 + -0x18);
      if (cVar1 < '\0') {
        if (cVar1 == -0x70) {
          this_00 = *(Object **)((long)pRVar2 + lVar3 + -0x10);
          if (this_00 != (Object *)0x0) {
            plVar5 = *(long **)((long)&pRVar2->repetitions + lVar3);
            Object::~Object(this_00);
            goto LAB_001cad8d;
          }
        }
        else if ((cVar1 == -0x80) &&
                (this_00 = *(Object **)((long)pRVar2 + lVar3 + -0x10), this_00 != (Object *)0x0)) {
          plVar5 = *(long **)((long)&pRVar2->repetitions + lVar3);
          ~AllocatedVector((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                           this_00);
LAB_001cad8d:
          if (plVar5 == (long *)0x0) {
            free(this_00);
          }
          else {
            (**(code **)(*plVar5 + 0x20))(plVar5,this_00);
          }
        }
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x28;
    } while (uVar4 < this->size);
  }
  if (this->allocator == (Allocator *)0x0) {
    free(this->items);
    return;
  }
  (**(code **)(*(long *)this->allocator + 0x20))();
  return;
}

Assistant:

~AllocatedVector() noexcept
    {
        for (decltype (size) i = 0; i < size; ++i)
            items[i].~ObjectType();

        freeBytes (allocator, items);
    }